

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataStatePtr
xmlAutomataNewCounterTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,int counter)

{
  if (counter < 0 || (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0)) {
    to = (xmlAutomataStatePtr)0x0;
  }
  else {
    xmlFAGenerateCountedTransition(am,from,to,counter);
    if (to == (xmlAutomataStatePtr)0x0) {
      to = am->state;
    }
  }
  return to;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCounterTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		xmlAutomataStatePtr to, int counter) {
    if ((am == NULL) || (from == NULL) || (counter < 0))
	return(NULL);
    xmlFAGenerateCountedTransition(am, from, to, counter);
    if (to == NULL)
	return(am->state);
    return(to);
}